

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O0

QDomNodePrivate * __thiscall
QDomDocumentTypePrivate::insertAfter
          (QDomDocumentTypePrivate *this,QDomNodePrivate *newChild,QDomNodePrivate *refChild)

{
  long lVar1;
  bool bVar2;
  QDomNodePrivate *pQVar3;
  QDomNodePrivate **value;
  QDomNodePrivate *in_RDX;
  QDomNodePrivate *in_RDI;
  long in_FS_OFFSET;
  QDomNodePrivate *p;
  QDomNodePrivate *in_stack_ffffffffffffff58;
  QDomNodePrivate **in_stack_ffffffffffffff60;
  QDomNodePrivate *in_stack_ffffffffffffff68;
  QString *key;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QDomNodePrivate::insertAfter(in_RDX,in_RDI,in_stack_ffffffffffffff68);
  if ((pQVar3 == (QDomNodePrivate *)0x0) ||
     (bVar2 = QDomNodePrivate::isEntity((QDomNodePrivate *)0x1137e4), !bVar2)) {
    if ((pQVar3 != (QDomNodePrivate *)0x0) &&
       (bVar2 = QDomNodePrivate::isNotation((QDomNodePrivate *)0x11385a), bVar2)) {
      value = (QDomNodePrivate **)(*(long *)&in_RDI[1].ref + 8);
      QDomNodePrivate::nodeName(in_stack_ffffffffffffff58);
      QMultiHash<QString,_QDomNodePrivate_*>::insert
                ((QMultiHash<QString,_QDomNodePrivate_*> *)in_RDI,
                 (QString *)in_stack_ffffffffffffff68,value);
      QString::~QString((QString *)0x1138ad);
    }
  }
  else {
    key = (QString *)(in_RDI[1]._vptr_QDomNodePrivate + 1);
    QDomNodePrivate::nodeName(in_stack_ffffffffffffff58);
    QMultiHash<QString,_QDomNodePrivate_*>::insert
              ((QMultiHash<QString,_QDomNodePrivate_*> *)in_RDI,key,in_stack_ffffffffffffff60);
    QString::~QString((QString *)0x113840);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return pQVar3;
}

Assistant:

QDomNodePrivate* QDomDocumentTypePrivate::insertAfter(QDomNodePrivate* newChild, QDomNodePrivate* refChild)
{
    // Call the original implementation
    QDomNodePrivate* p = QDomNodePrivate::insertAfter(newChild, refChild);
    // Update the maps
    if (p && p->isEntity())
        entities->map.insert(p->nodeName(), p);
    else if (p && p->isNotation())
        notations->map.insert(p->nodeName(), p);

    return p;
}